

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerIteration.cpp
# Opt level: O2

bool TestEigen(Matrix *m,initializer_list<EigenAnswer> c,double eps)

{
  long lVar1;
  iterator v;
  const_iterator __begin1;
  double dVar2;
  double dVar3;
  
  v = c._M_array;
  dVar3 = 0.0;
  for (lVar1 = c._M_len << 5; lVar1 != 0; lVar1 = lVar1 + -0x20) {
    dVar2 = Utils::EigValueNorm(m,&v->vector,v->value);
    dVar3 = dVar3 + dVar2;
    v = v + 1;
  }
  return dVar3 < eps;
}

Assistant:

bool TestEigen(const Matrix &m, std::initializer_list<EigenAnswer> c, double eps)
{
    double currentError = 0;

    for (const auto &now: c)
    {
        currentError += Utils::EigValueNorm(m, now.vector, now.value);
    }

    return eps > currentError;
}